

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall
embree::TokenStream::tryIdentifier(TokenStream *this,Token *token,ParseLocation *loc)

{
  int iVar1;
  uint *puVar2;
  Token *in_RDI;
  bool bVar3;
  string str;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Token *in_stack_fffffffffffffe70;
  undefined5 in_stack_fffffffffffffe78;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 uVar5;
  byte local_169;
  byte local_131;
  Stream<int> *in_stack_fffffffffffffee8;
  string local_a0 [63];
  byte local_61;
  ssize_t *local_60;
  ssize_t *local_58;
  ssize_t *local_50;
  ssize_t *local_48;
  uint local_3c;
  uint local_2c;
  uint local_1c;
  uint local_c;
  
  std::__cxx11::string::string(local_a0);
  local_48 = &(in_RDI->loc).colNumber;
  puVar2 = (uint *)Stream<int>::peek(in_stack_fffffffffffffee8);
  local_3c = *puVar2;
  local_131 = 0;
  if (local_3c < 0x100) {
    local_131 = *(byte *)((long)&in_RDI[4].loc.fileName.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + (ulong)local_3c);
  }
  if ((local_131 & 1) == 0) {
    local_61 = 0;
  }
  else {
    local_50 = &(in_RDI->loc).colNumber;
    iVar1 = Stream<int>::get(in_stack_fffffffffffffee8);
    std::__cxx11::string::operator+=(local_a0,(char)iVar1);
    while( true ) {
      local_58 = &(in_RDI->loc).colNumber;
      puVar2 = (uint *)Stream<int>::peek(in_stack_fffffffffffffee8);
      local_2c = *puVar2;
      local_169 = 0;
      if (local_2c < 0x100) {
        local_169 = *(byte *)((long)&in_RDI[4].loc.fileName.
                                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (ulong)local_2c);
      }
      bVar3 = (local_169 & 1) == 0;
      if (bVar3) {
        in_stack_fffffffffffffe7e = 0x2f < local_2c && local_2c < 0x3a;
        local_1c = local_2c;
      }
      bVar3 = !bVar3;
      uVar4 = bVar3 || 0x2f < local_2c && local_2c < 0x3a;
      local_c = local_2c;
      if (!bVar3 && (0x2f >= local_2c || local_2c >= 0x3a)) break;
      local_60 = &(in_RDI->loc).colNumber;
      in_stack_fffffffffffffe70 = (Token *)*local_60;
      in_stack_fffffffffffffe6c = Stream<int>::get(in_stack_fffffffffffffee8);
      std::__cxx11::string::operator+=(local_a0,(char)in_stack_fffffffffffffe6c);
    }
    uVar5 = uVar4;
    std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,local_a0);
    Token::Token(in_RDI,(string *)
                        CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe7e,
                                                CONCAT15(uVar4,in_stack_fffffffffffffe78))),
                 (Type)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (ParseLocation *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    Token::operator=(in_stack_fffffffffffffe70,
                     (Token *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    Token::~Token(in_stack_fffffffffffffe70);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    local_61 = 1;
  }
  std::__cxx11::string::~string(local_a0);
  return (bool)(local_61 & 1);
}

Assistant:

bool TokenStream::tryIdentifier(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (!isAlpha(cin->peek())) return false;
    str += (char)cin->get();
    while (isAlphaNum(cin->peek())) str += (char)cin->get();
    token = Token(str,Token::TY_IDENTIFIER,loc);
    return true;
  }